

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_8_True(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  float *data;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  float *pfVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  int iVar40;
  float *pfVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  ulong uVar45;
  int iVar46;
  long lVar47;
  int scale;
  long lVar48;
  int k_count;
  int iVar49;
  int iVar50;
  float *pfVar51;
  byte bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar93 [12];
  undefined1 auVar92 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  undefined1 auVar97 [64];
  int data_width;
  int local_110;
  float local_c8;
  
  auVar61._8_4_ = 0x3effffff;
  auVar61._0_8_ = 0x3effffff3effffff;
  auVar61._12_4_ = 0x3effffff;
  auVar92 = ZEXT1664(auVar61);
  auVar60._8_4_ = 0x80000000;
  auVar60._0_8_ = 0x8000000080000000;
  auVar60._12_4_ = 0x80000000;
  fVar67 = ipoint->scale;
  auVar97 = ZEXT464((uint)fVar67);
  auVar53 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)fVar67),auVar60,0xf8);
  auVar53 = ZEXT416((uint)(fVar67 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  fVar65 = -0.08 / (fVar67 * fVar67);
  scale = (int)auVar53._0_4_;
  auVar54._0_4_ = (int)auVar53._0_4_;
  auVar54._4_4_ = (int)auVar53._4_4_;
  auVar54._8_4_ = (int)auVar53._8_4_;
  auVar54._12_4_ = (int)auVar53._12_4_;
  auVar53 = vcvtdq2ps_avx(auVar54);
  auVar54 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)ipoint->x),auVar60,0xf8);
  auVar54 = ZEXT416((uint)(ipoint->x + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar56._0_8_ = (double)auVar54._0_4_;
  auVar56._8_8_ = auVar54._8_8_;
  auVar59._0_8_ = (double)fVar67;
  auVar59._8_8_ = 0;
  auVar54 = vfmadd231sd_fma(auVar56,auVar59,ZEXT816(0x3fe0000000000000));
  auVar58._0_4_ = (float)auVar54._0_8_;
  auVar58._4_12_ = auVar54._4_12_;
  auVar54 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)ipoint->y),auVar60,0xf8);
  fVar5 = auVar58._0_4_ - auVar53._0_4_;
  auVar54 = ZEXT416((uint)(ipoint->y + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar56 = ZEXT416((uint)fVar5);
  auVar55._0_8_ = (double)auVar54._0_4_;
  auVar55._8_8_ = auVar54._8_8_;
  auVar54 = vfmadd231sd_fma(auVar55,auVar59,ZEXT816(0x3fe0000000000000));
  auVar57._0_4_ = (float)auVar54._0_8_;
  auVar57._4_12_ = auVar54._4_12_;
  fVar96 = auVar57._0_4_ - auVar53._0_4_;
  auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar67),auVar58);
  auVar54 = vpternlogd_avx512vl(auVar61,auVar53,auVar60,0xf8);
  auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar54._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = ZEXT416((uint)fVar67);
  if (scale < (int)auVar53._0_4_) {
    auVar62._8_4_ = 0x3effffff;
    auVar62._0_8_ = 0x3effffff3effffff;
    auVar62._12_4_ = 0x3effffff;
    auVar63._8_4_ = 0x80000000;
    auVar63._0_8_ = 0x8000000080000000;
    auVar63._12_4_ = 0x80000000;
    auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar54,auVar57);
    auVar55 = vpternlogd_avx512vl(auVar63,auVar53,auVar62,0xea);
    auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar55._0_4_));
    auVar53 = vroundss_avx(auVar53,auVar53,0xb);
    if (scale < (int)auVar53._0_4_) {
      auVar53 = vfmadd231ss_fma(auVar58,auVar54,ZEXT416(0x41300000));
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      auVar55 = vpternlogd_avx512vl(auVar64,auVar53,auVar62,0xea);
      auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar55._0_4_));
      auVar53 = vroundss_avx(auVar53,auVar53,0xb);
      if ((int)auVar53._0_4_ + scale <= iimage->width) {
        auVar53 = vfmadd231ss_fma(auVar57,auVar54,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar55 = vpternlogd_avx512vl(auVar62,auVar53,auVar13,0xf8);
        auVar53 = ZEXT416((uint)(auVar53._0_4_ + auVar55._0_4_));
        auVar53 = vroundss_avx(auVar53,auVar53,0xb);
        if ((int)auVar53._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar41 = iimage->data;
          fVar5 = fVar5 + 0.5;
          iVar49 = scale * 2;
          pfVar36 = haarResponseY + 0x1f;
          pfVar51 = haarResponseX + 0x1f;
          uVar22 = 0xfffffff4;
          do {
            auVar53._0_4_ = (float)(int)uVar22;
            auVar53._4_12_ = in_ZMM8._4_12_;
            lVar31 = 0;
            auVar87._0_4_ = (float)(int)(uVar22 | 1);
            auVar87._4_12_ = in_ZMM8._4_12_;
            auVar53 = vfmadd213ss_fma(auVar53,auVar54,ZEXT416((uint)(fVar96 + 0.5)));
            auVar56 = vfmadd213ss_fma(auVar87,auVar54,ZEXT416((uint)(fVar96 + 0.5)));
            iVar18 = (int)auVar53._0_4_;
            iVar21 = (int)auVar56._0_4_;
            iVar19 = (iVar18 + -1) * iVar2;
            iVar17 = (iVar18 + -1 + scale) * iVar2;
            iVar20 = (iVar18 + -1 + iVar49) * iVar2;
            iVar25 = (iVar21 + -1) * iVar2;
            iVar18 = (iVar21 + -1 + scale) * iVar2;
            iVar21 = (iVar21 + -1 + iVar49) * iVar2;
            do {
              iVar26 = (int)lVar31;
              auVar79._0_4_ = (float)(iVar26 + -0xc);
              auVar79._4_12_ = in_ZMM8._4_12_;
              auVar53 = vfmadd213ss_fma(auVar79,auVar54,ZEXT416((uint)fVar5));
              iVar40 = (int)auVar53._0_4_;
              auVar80._0_4_ = (float)(iVar26 + -0xb);
              auVar93 = auVar92._4_12_;
              auVar80._4_12_ = auVar93;
              auVar53 = vfmadd213ss_fma(auVar80,auVar54,ZEXT416((uint)fVar5));
              iVar37 = (int)auVar53._0_4_;
              auVar81._0_4_ = (float)(iVar26 + -10);
              auVar81._4_12_ = auVar93;
              auVar56 = ZEXT416((uint)fVar5);
              auVar53 = vfmadd213ss_fma(auVar81,auVar54,auVar56);
              iVar27 = (int)auVar53._0_4_;
              auVar82._0_4_ = (float)(iVar26 + -9);
              auVar82._4_12_ = auVar93;
              auVar53 = vfmadd213ss_fma(auVar82,auVar54,auVar56);
              iVar28 = (int)auVar53._0_4_;
              auVar90._0_4_ = (float)(iVar26 + -8);
              auVar90._4_12_ = auVar93;
              auVar89._0_4_ = (float)(iVar26 + -7);
              auVar89._4_12_ = auVar93;
              auVar88._0_4_ = (float)(iVar26 + -6);
              auVar88._4_12_ = auVar93;
              auVar83._0_4_ = (float)(iVar26 + -5);
              auVar83._4_12_ = auVar93;
              auVar53 = vfmadd213ss_fma(auVar90,auVar54,auVar56);
              auVar56 = vfmadd213ss_fma(auVar89,auVar54,auVar56);
              auVar55 = vfmadd213ss_fma(auVar88,auVar54,ZEXT416((uint)fVar5));
              auVar57 = vfmadd213ss_fma(auVar83,auVar54,ZEXT416((uint)fVar5));
              iVar33 = iVar40 + -1 + scale;
              iVar35 = iVar40 + -1 + iVar49;
              fVar67 = pfVar41[iVar20 + -1 + iVar40];
              fVar66 = pfVar41[iVar19 + iVar35];
              auVar60 = SUB6416(ZEXT464(0x40000000),0);
              auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar19 + iVar33] -
                                                      pfVar41[iVar20 + iVar33])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar35] -
                                                      pfVar41[iVar19 + -1 + iVar40])));
              auVar59 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar17 + -1 + iVar40] -
                                                      pfVar41[iVar17 + iVar35])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar35] -
                                                      pfVar41[iVar19 + -1 + iVar40])));
              pfVar51[lVar31 + -0x1f] = (fVar67 - fVar66) + auVar58._0_4_;
              pfVar36[lVar31 + -0x1f] = auVar59._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar21 + -1 + iVar40];
              fVar66 = pfVar41[iVar25 + iVar35];
              iVar38 = iVar37 + -1 + iVar49;
              auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar25 + iVar33] -
                                                      pfVar41[iVar33 + iVar21])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar35 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar40])));
              auVar59 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar18 + -1 + iVar40] -
                                                      pfVar41[iVar18 + iVar35])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar35 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar40])));
              pfVar51[lVar31 + -7] = (fVar67 - fVar66) + auVar58._0_4_;
              pfVar36[lVar31 + -7] = auVar59._0_4_ - (fVar67 - fVar66);
              iVar33 = iVar37 + -1 + scale;
              fVar67 = pfVar41[iVar20 + -1 + iVar37];
              fVar66 = pfVar41[iVar19 + iVar38];
              auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar19 + iVar33] -
                                                      pfVar41[iVar20 + iVar33])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar38] -
                                                      pfVar41[iVar19 + -1 + iVar37])));
              auVar59 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar17 + -1 + iVar37] -
                                                      pfVar41[iVar17 + iVar38])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar38] -
                                                      pfVar41[iVar19 + -1 + iVar37])));
              pfVar51[lVar31 + -0x1e] = (fVar67 - fVar66) + auVar58._0_4_;
              pfVar36[lVar31 + -0x1e] = auVar59._0_4_ - (fVar67 - fVar66);
              iVar44 = (int)auVar53._0_4_;
              fVar67 = pfVar41[iVar21 + -1 + iVar37];
              fVar66 = pfVar41[iVar25 + iVar38];
              iVar40 = iVar27 + -1 + scale;
              iVar35 = iVar27 + -1 + iVar49;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar25 + iVar33] -
                                                      pfVar41[iVar33 + iVar21])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar38 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar37])));
              auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar18 + -1 + iVar37] -
                                                      pfVar41[iVar18 + iVar38])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar38 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar37])));
              pfVar51[lVar31 + -6] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -6] = auVar58._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar20 + -1 + iVar27];
              fVar66 = pfVar41[iVar19 + iVar35];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar17 + -1 + iVar27] -
                                                      pfVar41[iVar17 + iVar35])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar35] -
                                                      pfVar41[iVar19 + -1 + iVar27])));
              auVar58 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar19 + iVar40] -
                                                      pfVar41[iVar20 + iVar40])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar35] -
                                                      pfVar41[iVar19 + -1 + iVar27])));
              pfVar51[lVar31 + -0x1d] = (fVar67 - fVar66) + auVar58._0_4_;
              pfVar36[lVar31 + -0x1d] = auVar53._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar21 + -1 + iVar27];
              iVar37 = (int)auVar56._0_4_;
              fVar66 = pfVar41[iVar25 + iVar35];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar25 + iVar40] -
                                                      pfVar41[iVar40 + iVar21])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar35 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar27])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar18 + -1 + iVar27] -
                                                      pfVar41[iVar18 + iVar35])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar35 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar27])));
              pfVar51[lVar31 + -5] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -5] = auVar56._0_4_ - (fVar67 - fVar66);
              iVar35 = iVar28 + -1 + scale;
              iVar27 = iVar28 + -1 + iVar49;
              fVar67 = pfVar41[iVar20 + -1 + iVar28];
              fVar66 = pfVar41[iVar19 + iVar27];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar19 + iVar35] -
                                                      pfVar41[iVar20 + iVar35])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar27] -
                                                      pfVar41[iVar19 + -1 + iVar28])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar17 + -1 + iVar28] -
                                                      pfVar41[iVar17 + iVar27])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar27] -
                                                      pfVar41[iVar19 + -1 + iVar28])));
              pfVar51[lVar31 + -0x1c] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -0x1c] = auVar56._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar21 + -1 + iVar28];
              fVar66 = pfVar41[iVar25 + iVar27];
              iVar40 = iVar44 + -1 + scale;
              iVar33 = iVar44 + -1 + iVar49;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar25 + iVar35] -
                                                      pfVar41[iVar35 + iVar21])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar27 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar28])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar18 + -1 + iVar28] -
                                                      pfVar41[iVar18 + iVar27])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar27 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar28])));
              pfVar51[lVar31 + -4] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -4] = auVar56._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar20 + -1 + iVar44];
              fVar66 = pfVar41[iVar19 + iVar33];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar19 + iVar40] -
                                                      pfVar41[iVar20 + iVar40])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar33] -
                                                      pfVar41[iVar19 + -1 + iVar44])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar17 + -1 + iVar44] -
                                                      pfVar41[iVar17 + iVar33])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar33] -
                                                      pfVar41[iVar19 + -1 + iVar44])));
              pfVar51[lVar31 + -0x1b] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -0x1b] = auVar56._0_4_ - (fVar67 - fVar66);
              in_ZMM8 = ZEXT464((uint)pfVar41[iVar33 + iVar21]);
              iVar28 = (int)auVar55._0_4_;
              iVar35 = iVar37 + -1 + scale;
              fVar67 = pfVar41[iVar21 + -1 + iVar44];
              fVar66 = pfVar41[iVar25 + iVar33];
              iVar27 = iVar37 + -1 + iVar49;
              auVar56 = ZEXT416((uint)(pfVar41[iVar33 + iVar21] - pfVar41[iVar25 + -1 + iVar44]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar25 + iVar40] -
                                                      pfVar41[iVar40 + iVar21])),auVar60,auVar56);
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar18 + -1 + iVar44] -
                                                      pfVar41[iVar18 + iVar33])),auVar60,auVar56);
              pfVar51[lVar31 + -3] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -3] = auVar56._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar20 + -1 + iVar37];
              fVar66 = pfVar41[iVar19 + iVar27];
              iVar40 = (int)auVar57._0_4_;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar17 + -1 + iVar37] -
                                                      pfVar41[iVar17 + iVar27])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar27] -
                                                      pfVar41[iVar19 + -1 + iVar37])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar19 + iVar35] -
                                                      pfVar41[iVar20 + iVar35])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar27] -
                                                      pfVar41[iVar19 + -1 + iVar37])));
              pfVar51[lVar31 + -0x1a] = (fVar67 - fVar66) + auVar56._0_4_;
              pfVar36[lVar31 + -0x1a] = auVar53._0_4_ - (fVar67 - fVar66);
              auVar92 = ZEXT464((uint)pfVar41[iVar27 + iVar21]);
              fVar67 = pfVar41[iVar21 + -1 + iVar37];
              fVar66 = pfVar41[iVar25 + iVar27];
              iVar33 = iVar28 + -1 + scale;
              auVar56 = ZEXT416((uint)(pfVar41[iVar27 + iVar21] - pfVar41[iVar25 + -1 + iVar37]));
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar25 + iVar35] -
                                                      pfVar41[iVar35 + iVar21])),auVar60,auVar56);
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar18 + -1 + iVar37] -
                                                      pfVar41[iVar18 + iVar27])),auVar60,auVar56);
              iVar27 = iVar28 + -1 + iVar49;
              pfVar51[lVar31 + -2] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -2] = auVar56._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar20 + -1 + iVar28];
              fVar66 = pfVar41[iVar19 + iVar27];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar19 + iVar33] -
                                                      pfVar41[iVar20 + iVar33])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar27] -
                                                      pfVar41[iVar19 + -1 + iVar28])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar17 + -1 + iVar28] -
                                                      pfVar41[iVar17 + iVar27])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar27] -
                                                      pfVar41[iVar19 + -1 + iVar28])));
              pfVar51[lVar31 + -0x19] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -0x19] = auVar56._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar21 + -1 + iVar28];
              fVar66 = pfVar41[iVar25 + iVar27];
              iVar35 = iVar40 + -1 + scale;
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar25 + iVar33] -
                                                      pfVar41[iVar33 + iVar21])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar27 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar28])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar18 + -1 + iVar28] -
                                                      pfVar41[iVar18 + iVar27])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar27 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar28])));
              iVar27 = iVar40 + -1 + iVar49;
              pfVar51[lVar31 + -1] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -1] = auVar56._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar20 + -1 + iVar40];
              fVar66 = pfVar41[iVar19 + iVar27];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar19 + iVar35] -
                                                      pfVar41[iVar20 + iVar35])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar27] -
                                                      pfVar41[iVar19 + -1 + iVar40])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar17 + -1 + iVar40] -
                                                      pfVar41[iVar17 + iVar27])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar20 + iVar27] -
                                                      pfVar41[iVar19 + -1 + iVar40])));
              pfVar51[lVar31 + -0x18] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31 + -0x18] = auVar56._0_4_ - (fVar67 - fVar66);
              fVar67 = pfVar41[iVar21 + -1 + iVar40];
              fVar66 = pfVar41[iVar25 + iVar27];
              auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar25 + iVar35] -
                                                      pfVar41[iVar35 + iVar21])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar27 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar40])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar41[iVar18 + -1 + iVar40] -
                                                      pfVar41[iVar18 + iVar27])),auVar60,
                                        ZEXT416((uint)(pfVar41[iVar27 + iVar21] -
                                                      pfVar41[iVar25 + -1 + iVar40])));
              pfVar51[lVar31] = (fVar67 - fVar66) + auVar53._0_4_;
              pfVar36[lVar31] = auVar56._0_4_ - (fVar67 - fVar66);
              lVar31 = lVar31 + 8;
            } while (iVar26 + -0xc < 4);
            pfVar36 = pfVar36 + 0x30;
            pfVar51 = pfVar51 + 0x30;
            bVar4 = (int)uVar22 < 10;
            uVar22 = uVar22 + 2;
          } while (bVar4);
          goto LAB_001be4fe;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar31 = 0;
  uVar22 = 0xfffffff4;
  do {
    auVar68._0_4_ = (float)(int)uVar22;
    auVar68._4_12_ = in_ZMM8._4_12_;
    auVar71._0_4_ = (float)(int)(uVar22 | 1);
    auVar71._4_12_ = in_ZMM8._4_12_;
    auVar53 = vfmadd213ss_fma(auVar68,auVar97._0_16_,ZEXT416((uint)fVar96));
    auVar55 = vfmadd213ss_fma(auVar71,auVar97._0_16_,ZEXT416((uint)fVar96));
    fVar66 = auVar53._0_4_;
    fVar70 = auVar55._0_4_;
    iVar19 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
    iVar25 = iVar2 + iVar19;
    iVar26 = iVar19 + -1;
    iVar27 = iVar19 + -1 + scale;
    iVar20 = iVar2 + -1 + iVar19;
    iVar17 = (int)((double)((ulong)(0.0 <= fVar70) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar70) * -0x4020000000000000) + (double)fVar70);
    iVar21 = iVar2 + iVar17;
    iVar35 = iVar17 + -1;
    iVar28 = iVar17 + -1 + scale;
    iVar18 = iVar2 + -1 + iVar17;
    pfVar41 = haarResponseX;
    pfVar51 = haarResponseY;
    lVar30 = lVar31;
    iVar49 = -0xc;
    do {
      auVar69._0_4_ = (float)iVar49;
      auVar93 = in_ZMM8._4_12_;
      auVar69._4_12_ = auVar93;
      auVar58 = auVar97._0_16_;
      auVar53 = vfmadd213ss_fma(auVar69,auVar58,auVar56);
      auVar85._0_4_ = (float)(iVar49 + 1);
      auVar85._4_12_ = auVar93;
      auVar77._0_4_ = (float)(iVar49 + 2);
      auVar77._4_12_ = auVar93;
      auVar74._0_4_ = (float)(iVar49 + 3);
      auVar74._4_12_ = auVar93;
      auVar55 = vfmadd213ss_fma(auVar85,auVar58,auVar56);
      auVar57 = vfmadd213ss_fma(auVar77,auVar58,auVar56);
      auVar58 = vfmadd213ss_fma(auVar74,auVar58,auVar56);
      fVar66 = auVar53._0_4_;
      fVar84 = auVar55._0_4_;
      fVar76 = auVar57._0_4_;
      fVar70 = auVar58._0_4_;
      iVar33 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
      if (((iVar19 < 1) || (iVar33 < 1)) || (iimage->height < iVar25)) {
LAB_001bd18e:
        haarXY(iimage,iVar19,iVar33,scale,(float *)((long)pfVar41 + lVar30),
               (float *)((long)pfVar51 + lVar30));
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar40 = iimage->width;
        iVar37 = iVar2 + iVar33;
        if (iVar40 < iVar37) goto LAB_001bd18e;
        iVar38 = iimage->data_width;
        pfVar36 = iimage->data;
        iVar50 = iVar33 + -1 + scale;
        iVar46 = iVar38 * iVar26;
        iVar44 = iVar38 * iVar20;
        fVar66 = pfVar36[iVar44 + -1 + iVar33];
        fVar73 = pfVar36[iVar46 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar46 + iVar50] - pfVar36[iVar44 + iVar50]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar36[iVar44 + -1 + iVar37] -
                                                pfVar36[iVar46 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar36[iVar38 * iVar27 + -1 + iVar33] -
                                                pfVar36[iVar38 * iVar27 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar36[iVar44 + -1 + iVar37] -
                                                pfVar36[iVar46 + -1 + iVar33])));
        *(float *)((long)pfVar41 + lVar30) = (fVar66 - fVar73) + auVar53._0_4_;
        *(float *)((long)pfVar51 + lVar30) = auVar55._0_4_ - (fVar66 - fVar73);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x60);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x60);
      if (((iVar17 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar21 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar17,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar44 = iVar33 + -1 + scale;
        iVar50 = iVar38 * iVar35;
        iVar46 = iVar38 * iVar18;
        fVar66 = pfVar3[iVar46 + -1 + iVar33];
        fVar73 = pfVar3[iVar50 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar50 + iVar44] - pfVar3[iVar46 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar28 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar73) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar73);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 4);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 4);
      iVar33 = (int)((double)((ulong)(0.0 <= fVar84) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar84) * -0x4020000000000000) + (double)fVar84);
      if (((iVar19 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar19,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar33 + -1 + scale;
        iVar44 = iVar38 * iVar26;
        iVar50 = iVar38 * iVar20;
        fVar66 = pfVar3[iVar50 + -1 + iVar33];
        fVar84 = pfVar3[iVar44 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar46] - pfVar3[iVar50 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar27 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar27 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar84) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar84);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 100);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 100);
      if ((((iVar17 < 1) || (iVar33 < 1)) || (iimage->height < iVar21)) ||
         (iVar37 = iVar2 + iVar33, iVar40 < iVar37)) {
        haarXY(iimage,iVar17,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar44 = iVar33 + -1 + scale;
        iVar50 = iVar38 * iVar35;
        iVar46 = iVar38 * iVar18;
        fVar66 = pfVar3[iVar46 + -1 + iVar33];
        fVar84 = pfVar3[iVar50 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar50 + iVar44] - pfVar3[iVar46 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar28 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar84) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar84);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 8);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 8);
      iVar33 = (int)((double)((ulong)(0.0 <= fVar76) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar76) * -0x4020000000000000) + (double)fVar76);
      if (((iVar19 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar19,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar33 + -1 + scale;
        iVar44 = iVar38 * iVar26;
        iVar50 = iVar38 * iVar20;
        fVar66 = pfVar3[iVar50 + -1 + iVar33];
        fVar76 = pfVar3[iVar44 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar46] - pfVar3[iVar50 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar27 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar27 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar76) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar76);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x68);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x68);
      if (((iVar17 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar21 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar17,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar44 = iVar33 + -1 + scale;
        iVar50 = iVar38 * iVar35;
        iVar46 = iVar38 * iVar18;
        fVar66 = pfVar3[iVar46 + -1 + iVar33];
        fVar76 = pfVar3[iVar50 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar50 + iVar44] - pfVar3[iVar46 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar28 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar76) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar76);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0xc);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0xc);
      iVar33 = (int)((double)((ulong)(0.0 <= fVar70) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar70) * -0x4020000000000000) + (double)fVar70);
      if ((((iVar19 < 1) || (iVar33 < 1)) || (iimage->height < iVar25)) ||
         (iVar37 = iVar2 + iVar33, iVar40 < iVar37)) {
        haarXY(iimage,iVar19,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar33 + -1 + scale;
        iVar44 = iVar38 * iVar26;
        iVar50 = iVar38 * iVar20;
        fVar66 = pfVar3[iVar50 + -1 + iVar33];
        fVar70 = pfVar3[iVar44 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar46] - pfVar3[iVar50 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar27 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar27 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar70);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x6c);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x6c);
      if (((iVar17 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar21 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar17,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar44 = iVar33 + -1 + scale;
        iVar50 = iVar38 * iVar35;
        iVar46 = iVar38 * iVar18;
        fVar66 = pfVar3[iVar46 + -1 + iVar33];
        fVar70 = pfVar3[iVar50 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar50 + iVar44] - pfVar3[iVar46 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar28 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar70);
      }
      auVar53 = vpbroadcastd_avx512vl();
      auVar53 = vpaddd_avx(auVar53,_DAT_005997a0);
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x10);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x10);
      auVar53 = vcvtdq2ps_avx(auVar53);
      auVar15._4_4_ = fVar5;
      auVar15._0_4_ = fVar5;
      auVar15._8_4_ = fVar5;
      auVar15._12_4_ = fVar5;
      auVar16._4_4_ = fVar67;
      auVar16._0_4_ = fVar67;
      auVar16._8_4_ = fVar67;
      auVar16._12_4_ = fVar67;
      auVar55 = vfmadd132ps_fma(auVar53,auVar15,auVar16);
      auVar53 = vshufps_avx(auVar55,auVar55,0xff);
      uVar23 = vcmpps_avx512vl(auVar55,_DAT_00599190,0xd);
      bVar52 = (byte)(uVar23 >> 3);
      iVar33 = (int)((double)((ulong)(bVar52 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 & 1) * -0x4020000000000000) +
                    (double)auVar53._0_4_);
      if (((iVar19 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar19,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar33 + -1 + scale;
        iVar44 = iVar38 * iVar26;
        iVar50 = iVar38 * iVar20;
        fVar66 = pfVar3[iVar50 + -1 + iVar33];
        fVar70 = pfVar3[iVar44 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar46] - pfVar3[iVar50 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar27 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar27 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar66 - fVar70);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x70);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x70);
      if ((((iVar17 < 1) || (iVar33 < 1)) || (iimage->height < iVar21)) ||
         (iVar37 = iVar2 + iVar33, iVar40 < iVar37)) {
        haarXY(iimage,iVar17,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar44 = iVar33 + -1 + scale;
        iVar50 = iVar38 * iVar35;
        iVar46 = iVar38 * iVar18;
        fVar66 = pfVar3[iVar46 + -1 + iVar33];
        fVar70 = pfVar3[iVar50 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar50 + iVar44] - pfVar3[iVar46 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar28 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar66 - fVar70);
      }
      auVar53 = vpermilpd_avx(auVar55,1);
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x14);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x14);
      bVar52 = (byte)uVar23;
      iVar33 = (int)((double)((ulong)(bVar52 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar53._0_4_);
      if (((iVar19 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar19,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar33 + -1 + scale;
        iVar44 = iVar38 * iVar26;
        iVar50 = iVar38 * iVar20;
        fVar66 = pfVar3[iVar50 + -1 + iVar33];
        fVar70 = pfVar3[iVar44 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar46] - pfVar3[iVar50 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar27 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar27 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar66 - fVar70);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x74);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x74);
      if (((iVar17 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar21 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar17,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar44 = iVar33 + -1 + scale;
        iVar50 = iVar38 * iVar35;
        iVar46 = iVar38 * iVar18;
        fVar66 = pfVar3[iVar46 + -1 + iVar33];
        fVar70 = pfVar3[iVar50 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar50 + iVar44] - pfVar3[iVar46 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar28 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar66 - fVar70);
      }
      auVar53 = vmovshdup_avx(auVar55);
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x18);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x18);
      iVar33 = (int)((double)((ulong)(bVar52 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar53._0_4_);
      if ((((iVar19 < 1) || (iVar33 < 1)) || (iimage->height < iVar25)) ||
         (iVar37 = iVar2 + iVar33, iVar40 < iVar37)) {
        haarXY(iimage,iVar19,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar33 + -1 + scale;
        iVar44 = iVar38 * iVar26;
        iVar50 = iVar38 * iVar20;
        fVar66 = pfVar3[iVar50 + -1 + iVar33];
        fVar70 = pfVar3[iVar44 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar46] - pfVar3[iVar50 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar27 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar27 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar66 - fVar70);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x78);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x78);
      if (((iVar17 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar21 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar17,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar44 = iVar33 + -1 + scale;
        iVar50 = iVar38 * iVar35;
        iVar46 = iVar38 * iVar18;
        fVar66 = pfVar3[iVar46 + -1 + iVar33];
        fVar70 = pfVar3[iVar50 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar50 + iVar44] - pfVar3[iVar46 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar28 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar37] -
                                                pfVar3[iVar50 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar57._0_4_ - (fVar66 - fVar70);
      }
      local_c8 = auVar55._0_4_;
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x1c);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x1c);
      iVar33 = (int)((double)((ulong)(bVar52 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar52 & 1) * -0x4020000000000000) + (double)local_c8);
      if (((iVar19 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar25 || (iVar37 = iVar2 + iVar33, iVar40 < iVar37)))) {
        haarXY(iimage,iVar19,iVar33,scale,pfVar36,pfVar1);
        iVar40 = iimage->width;
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar46 = iVar33 + -1 + scale;
        iVar44 = iVar38 * iVar26;
        iVar50 = iVar38 * iVar20;
        fVar66 = pfVar3[iVar50 + -1 + iVar33];
        fVar70 = pfVar3[iVar44 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar44 + iVar46] - pfVar3[iVar50 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar27 + -1 + iVar33] -
                                                pfVar3[iVar38 * iVar27 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar50 + -1 + iVar37] -
                                                pfVar3[iVar44 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar70);
      }
      pfVar36 = (float *)((long)pfVar41 + lVar30 + 0x7c);
      pfVar1 = (float *)((long)pfVar51 + lVar30 + 0x7c);
      if ((((iVar17 < 1) || (iVar33 < 1)) || (iimage->height < iVar21)) ||
         (iVar37 = iVar2 + iVar33, iVar40 < iVar37)) {
        haarXY(iimage,iVar17,iVar33,scale,pfVar36,pfVar1);
        pfVar41 = haarResponseX;
        pfVar51 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar38 = iVar33 + -1 + scale;
        iVar46 = iVar40 * iVar35;
        iVar44 = iVar40 * iVar18;
        fVar66 = pfVar3[iVar44 + -1 + iVar33];
        fVar70 = pfVar3[iVar46 + -1 + iVar37];
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar38] - pfVar3[iVar44 + iVar38]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar37] -
                                                pfVar3[iVar46 + -1 + iVar33])));
        auVar55 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar40 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar40 * iVar28 + -1 + iVar37])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar37] -
                                                pfVar3[iVar46 + -1 + iVar33])));
        *pfVar36 = (fVar66 - fVar70) + auVar53._0_4_;
        *pfVar1 = auVar55._0_4_ - (fVar66 - fVar70);
      }
      auVar97 = ZEXT1664(auVar54);
      lVar30 = lVar30 + 0x20;
      bVar4 = iVar49 < 4;
      iVar49 = iVar49 + 8;
    } while (bVar4);
    lVar31 = lVar31 + 0xc0;
    bVar4 = (int)uVar22 < 10;
    uVar22 = uVar22 + 2;
  } while (bVar4);
LAB_001be4fe:
  fVar96 = auVar97._0_4_;
  auVar95._8_4_ = 0x3effffff;
  auVar95._0_8_ = 0x3effffff3effffff;
  auVar95._12_4_ = 0x3effffff;
  auVar94._8_4_ = 0x80000000;
  auVar94._0_8_ = 0x8000000080000000;
  auVar94._12_4_ = 0x80000000;
  auVar53 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 0.5)),auVar94,0xf8);
  auVar53 = ZEXT416((uint)(fVar96 * 0.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 1.5)),auVar94,0xf8);
  auVar54 = ZEXT416((uint)(fVar96 * 1.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar56 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 2.5)),auVar94,0xf8);
  auVar56 = ZEXT416((uint)(fVar96 * 2.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar55 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 3.5)),auVar94,0xf8);
  auVar55 = ZEXT416((uint)(fVar96 * 3.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar57 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 4.5)),auVar94,0xf8);
  auVar57 = ZEXT416((uint)(fVar96 * 4.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 5.5)),auVar94,0xf8);
  auVar58 = ZEXT416((uint)(fVar96 * 5.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 6.5)),auVar94,0xf8);
  auVar59 = ZEXT416((uint)(fVar96 * 6.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 7.5)),auVar94,0xf8);
  auVar60 = ZEXT416((uint)(auVar60._0_4_ + fVar96 * 7.5));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 8.5)),auVar94,0xf8);
  auVar61 = ZEXT416((uint)(fVar96 * 8.5 + auVar61._0_4_));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 9.5)),auVar94,0xf8);
  auVar62 = ZEXT416((uint)(fVar96 * 9.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 10.5)),auVar94,0xf8);
  auVar63 = ZEXT416((uint)(fVar96 * 10.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar95,ZEXT416((uint)(fVar96 * 11.5)),auVar94,0xf8);
  fVar73 = auVar56._0_4_;
  fVar67 = fVar73 + auVar54._0_4_;
  fVar5 = fVar73 + auVar53._0_4_;
  auVar56 = ZEXT416((uint)(fVar96 * 11.5 + auVar64._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  fVar96 = fVar73 - auVar53._0_4_;
  fVar66 = fVar73 - auVar54._0_4_;
  fVar70 = fVar73 - auVar55._0_4_;
  fVar76 = fVar73 - auVar57._0_4_;
  fVar84 = fVar73 - auVar58._0_4_;
  fVar73 = fVar73 - auVar59._0_4_;
  fVar91 = auVar60._0_4_;
  fVar6 = fVar91 - auVar55._0_4_;
  fVar7 = fVar91 - auVar57._0_4_;
  fVar8 = fVar91 - auVar58._0_4_;
  fVar9 = fVar91 - auVar59._0_4_;
  fVar10 = fVar91 - auVar61._0_4_;
  fVar11 = fVar91 - auVar62._0_4_;
  fVar12 = fVar91 - auVar63._0_4_;
  fVar91 = fVar91 - auVar56._0_4_;
  gauss_s1_c0[0] = expf(fVar67 * fVar67 * fVar65);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar65);
  gauss_s1_c0[2] = expf(fVar96 * fVar96 * fVar65);
  gauss_s1_c0[3] = expf(fVar66 * fVar66 * fVar65);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar70 * fVar70 * fVar65);
  gauss_s1_c0[6] = expf(fVar76 * fVar76 * fVar65);
  gauss_s1_c0[7] = expf(fVar84 * fVar84 * fVar65);
  gauss_s1_c0[8] = expf(fVar73 * fVar73 * fVar65);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar65);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar65);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar65);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar65);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar65);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar65);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar65);
  gauss_s1_c1[8] = expf(fVar91 * fVar91 * fVar65);
  auVar72._8_4_ = 0x7fffffff;
  auVar72._0_8_ = 0x7fffffff7fffffff;
  auVar72._12_4_ = 0x7fffffff;
  uVar23 = 0xfffffff8;
  fVar67 = 0.0;
  lVar31 = 0;
  lVar30 = 0;
  local_110 = 0;
  do {
    pfVar41 = gauss_s1_c1;
    uVar22 = (uint)uVar23;
    if (uVar22 != 7) {
      pfVar41 = gauss_s1_c0;
    }
    lVar47 = (long)local_110;
    lVar30 = (long)(int)lVar30;
    if (uVar22 == 0xfffffff8) {
      pfVar41 = gauss_s1_c1;
    }
    uVar45 = 0;
    local_110 = local_110 + 4;
    uVar39 = 0xfffffff8;
    lVar42 = (long)haarResponseX + lVar31;
    lVar32 = (long)haarResponseY + lVar31;
    do {
      pfVar51 = gauss_s1_c1;
      if (uVar39 != 7) {
        pfVar51 = gauss_s1_c0;
      }
      auVar92 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar39 == 0xfffffff8) {
        pfVar51 = gauss_s1_c1;
      }
      uVar24 = (ulong)(uVar39 >> 0x1c & 0xfffffff8);
      uVar29 = uVar45;
      lVar34 = lVar32;
      lVar48 = lVar42;
      do {
        lVar43 = 0;
        pfVar36 = (float *)((long)pfVar41 + (ulong)(uint)((int)(uVar23 >> 0x1f) << 5));
        do {
          fVar5 = pfVar51[uVar24] * *pfVar36;
          pfVar36 = pfVar36 + (ulong)(~uVar22 >> 0x1f) * 2 + -1;
          auVar53 = vinsertps_avx(ZEXT416(*(uint *)(lVar34 + lVar43 * 4)),
                                  ZEXT416(*(uint *)(lVar48 + lVar43 * 4)),0x10);
          lVar43 = lVar43 + 1;
          auVar86._0_4_ = fVar5 * auVar53._0_4_;
          auVar86._4_4_ = fVar5 * auVar53._4_4_;
          auVar86._8_4_ = fVar5 * auVar53._8_4_;
          auVar86._12_4_ = fVar5 * auVar53._12_4_;
          auVar53 = vandps_avx(auVar86,auVar72);
          auVar53 = vmovlhps_avx(auVar86,auVar53);
          auVar75._0_4_ = auVar92._0_4_ + auVar53._0_4_;
          auVar75._4_4_ = auVar92._4_4_ + auVar53._4_4_;
          auVar75._8_4_ = auVar92._8_4_ + auVar53._8_4_;
          auVar75._12_4_ = auVar92._12_4_ + auVar53._12_4_;
          auVar92 = ZEXT1664(auVar75);
        } while (lVar43 != 9);
        uVar29 = uVar29 + 0x18;
        uVar24 = uVar24 + (ulong)(-1 < (int)uVar39) * 2 + -1;
        lVar48 = lVar48 + 0x60;
        lVar34 = lVar34 + 0x60;
      } while (uVar29 < uVar39 * 0x18 + 0x198);
      uVar39 = uVar39 + 5;
      uVar45 = uVar45 + 0x78;
      fVar5 = gauss_s2_arr[lVar47];
      auVar14._4_4_ = fVar5;
      auVar14._0_4_ = fVar5;
      auVar14._8_4_ = fVar5;
      auVar14._12_4_ = fVar5;
      auVar55 = vmulps_avx512vl(auVar75,auVar14);
      lVar47 = lVar47 + 1;
      auVar78._0_4_ = auVar55._0_4_ * auVar55._0_4_;
      auVar78._4_4_ = auVar55._4_4_ * auVar55._4_4_;
      auVar78._8_4_ = auVar55._8_4_ * auVar55._8_4_;
      auVar78._12_4_ = auVar55._12_4_ * auVar55._12_4_;
      auVar54 = vshufpd_avx(auVar55,auVar55,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar30) = auVar55;
      lVar30 = lVar30 + 4;
      lVar42 = lVar42 + 0x1e0;
      lVar32 = lVar32 + 0x1e0;
      auVar53 = vmovshdup_avx(auVar78);
      auVar56 = vfmadd231ss_fma(auVar53,auVar55,auVar55);
      auVar53 = vshufps_avx(auVar55,auVar55,0xff);
      auVar54 = vfmadd213ss_fma(auVar54,auVar54,auVar56);
      auVar53 = vfmadd213ss_fma(auVar53,auVar53,auVar54);
      fVar67 = fVar67 + auVar53._0_4_;
    } while (local_110 != (int)lVar47);
    lVar31 = lVar31 + 0x14;
    uVar23 = (ulong)(uVar22 + 5);
  } while ((int)uVar22 < 3);
  if (fVar67 < 0.0) {
    fVar67 = sqrtf(fVar67);
  }
  else {
    auVar53 = vsqrtss_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
    fVar67 = auVar53._0_4_;
  }
  lVar31 = 0;
  auVar92 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar67)));
  do {
    auVar97 = vmulps_avx512f(auVar92,*(undefined1 (*) [64])(ipoint->descriptor + lVar31));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar31) = auVar97;
    lVar31 = lVar31 + 0x10;
  } while (lVar31 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_8_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count1*24+k_count6], &haarResponseY[l_count1*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count1*24+k_count7], &haarResponseY[l_count1*24+k_count7]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}